

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplashscreen.cpp
# Opt level: O0

bool __thiscall QSplashScreen::event(QSplashScreen *this,QEvent *e)

{
  bool bVar1;
  Type TVar2;
  QSplashScreenPrivate *widget;
  QEvent *in_RSI;
  QSplashScreenPrivate *unaff_retaddr;
  QSplashScreenPrivate *d;
  QEvent *in_stack_00000128;
  QWidget *in_stack_00000130;
  
  widget = d_func((QSplashScreen *)0x697770);
  TVar2 = QEvent::type(in_RSI);
  if (TVar2 == Paint) {
    QSplashScreenPrivate::handlePaintEvent(unaff_retaddr);
  }
  else if (TVar2 == Show) {
    waitForWidgetMapped((QWidget *)widget,0x11);
  }
  bVar1 = QWidget::event(in_stack_00000130,in_stack_00000128);
  return bVar1;
}

Assistant:

bool QSplashScreen::event(QEvent *e)
{
    Q_D(QSplashScreen);

    switch (e->type()) {
    case QEvent::Paint:
        d->handlePaintEvent();
        break;
    case QEvent::Show:
        waitForWidgetMapped(this);
        break;
    default:
        break;
    }

    return QWidget::event(e);
}